

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

unsigned_short Extra_TruthPerm4One(uint uTruth,int Phase)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (0xf < (uint)Phase) {
    __assert_fail("Phase >= 0 && Phase < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0x3b4,"unsigned short Extra_TruthPerm4One(unsigned int, int)");
  }
  uVar4 = uTruth;
  if ((0x808bUL >> ((ulong)(uint)Phase & 0x3f) & 1) == 0) {
    uVar1 = (ulong)(uint)Phase;
    if ((0x114UL >> (uVar1 & 0x3f) & 1) == 0) {
      uVar4 = 0;
      uVar5 = 0;
      do {
        if ((uTruth >> (uVar5 & 0x1f) & 1) != 0) {
          lVar2 = 0;
          uVar6 = 0;
          do {
            uVar3 = 1 << ((byte)lVar2 & 0x1f);
            if ((uVar5 >> (Extra_TruthPerm4One::Perms[uVar1][lVar2] & 0x1fU) & 1) == 0) {
              uVar3 = 0;
            }
            uVar6 = uVar6 | uVar3;
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          uVar4 = uVar4 | 1 << (uVar6 & 0x1f);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0x10);
    }
    else {
      uVar4 = (uint)Extra_TruthPerm4One::Cases[uVar1];
    }
  }
  return (unsigned_short)uVar4;
}

Assistant:

unsigned short Extra_TruthPerm4One( unsigned uTruth, int Phase )
{
    // cases
    static unsigned short Cases[16] = {
        0,      // 0000  - skip
        0,      // 0001  - skip
        0xCCCC, // 0010  - single var
        0,      // 0011  - skip
        0xF0F0, // 0100  - single var
        1,      // 0101
        1,      // 0110
        0,      // 0111  - skip
        0xFF00, // 1000  - single var
        1,      // 1001
        1,      // 1010
        1,      // 1011
        1,      // 1100
        1,      // 1101
        1,      // 1110
        0       // 1111  - skip
    };
    // permutations
    static int Perms[16][4] = {
        { 0, 0, 0, 0 }, // 0000  - skip
        { 0, 0, 0, 0 }, // 0001  - skip
        { 0, 0, 0, 0 }, // 0010  - single var
        { 0, 0, 0, 0 }, // 0011  - skip
        { 0, 0, 0, 0 }, // 0100  - single var
        { 0, 2, 1, 3 }, // 0101
        { 2, 0, 1, 3 }, // 0110
        { 0, 0, 0, 0 }, // 0111  - skip
        { 0, 0, 0, 0 }, // 1000  - single var
        { 0, 2, 3, 1 }, // 1001
        { 2, 0, 3, 1 }, // 1010
        { 0, 1, 3, 2 }, // 1011
        { 2, 3, 0, 1 }, // 1100
        { 0, 3, 1, 2 }, // 1101
        { 3, 0, 1, 2 }, // 1110
        { 0, 0, 0, 0 }  // 1111  - skip
    };
    int i, k, iRes;
    unsigned uTruthRes;
    assert( Phase >= 0 && Phase < 16 );
    if ( Cases[Phase] == 0 )
        return uTruth;
    if ( Cases[Phase] > 1 )
        return Cases[Phase];
    uTruthRes = 0;
    for ( i = 0; i < 16; i++ )
        if ( uTruth & (1 << i) )
        {
            for ( iRes = 0, k = 0; k < 4; k++ )
                if ( i & (1 << Perms[Phase][k]) )
                    iRes |= (1 << k);
            uTruthRes |= (1 << iRes);
        }
    return uTruthRes;
}